

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

Context * __thiscall aeron::archive::Context::controlRequestChannel(Context *this,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  string __str;
  ChannelUri uri;
  string local_e0;
  ChannelUri local_c0;
  
  ChannelUri::parse(&local_c0,value);
  uVar3 = (this->cfg_).controlTermBufferLength;
  uVar4 = -uVar3;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  uVar8 = 1;
  if (9 < uVar4) {
    uVar7 = (ulong)uVar4;
    uVar5 = 4;
    do {
      uVar8 = uVar5;
      uVar6 = (uint)uVar7;
      if (uVar6 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_00139e52;
      }
      if (uVar6 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_00139e52;
      }
      if (uVar6 < 10000) goto LAB_00139e52;
      uVar7 = uVar7 / 10000;
      uVar5 = uVar8 + 4;
    } while (99999 < uVar6);
    uVar8 = uVar8 + 1;
  }
LAB_00139e52:
  paVar1 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_e0,(char)uVar8 - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_e0._M_dataplus._M_p + (uVar3 >> 0x1f),uVar8,uVar4);
  ChannelUri::put(&local_c0,(string *)(anonymous_namespace)::TERM_LENGTH_PARAM_NAME_abi_cxx11_,
                  &local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  uVar3 = (this->cfg_).controlMtuLength;
  uVar4 = -uVar3;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  uVar8 = 1;
  if (9 < uVar4) {
    uVar7 = (ulong)uVar4;
    uVar5 = 4;
    do {
      uVar8 = uVar5;
      uVar6 = (uint)uVar7;
      if (uVar6 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_00139f17;
      }
      if (uVar6 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_00139f17;
      }
      if (uVar6 < 10000) goto LAB_00139f17;
      uVar7 = uVar7 / 10000;
      uVar5 = uVar8 + 4;
    } while (99999 < uVar6);
    uVar8 = uVar8 + 1;
  }
LAB_00139f17:
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_e0,(char)uVar8 - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_e0._M_dataplus._M_p + (uVar3 >> 0x1f),uVar8,uVar4);
  ChannelUri::put(&local_c0,(string *)(anonymous_namespace)::MTU_LENGTH_PARAM_NAME_abi_cxx11_,
                  &local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  bVar2 = (this->cfg_).controlTermBufferSparse;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_e0,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_e0._M_dataplus._M_p,1,(uint)bVar2);
  ChannelUri::put(&local_c0,(string *)(anonymous_namespace)::SPARSE_PARAM_NAME_abi_cxx11_,&local_e0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  ChannelUri::toString_abi_cxx11_(&local_e0,&local_c0);
  std::__cxx11::string::operator=((string *)&this->controlRequestChannel_,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0.tags_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c0.params_._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.media_._M_dataplus._M_p != &local_c0.media_.field_2) {
    operator_delete(local_c0.media_._M_dataplus._M_p,
                    local_c0.media_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.prefix_._M_dataplus._M_p != &local_c0.prefix_.field_2) {
    operator_delete(local_c0.prefix_._M_dataplus._M_p,
                    local_c0.prefix_.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

Context& Context::controlRequestChannel(const std::string& value) {
    ChannelUri uri = ChannelUri::parse(value);
    uri.put(TERM_LENGTH_PARAM_NAME, std::to_string(cfg_.controlTermBufferLength));
    uri.put(MTU_LENGTH_PARAM_NAME, std::to_string(cfg_.controlMtuLength));
    uri.put(SPARSE_PARAM_NAME, std::to_string(cfg_.controlTermBufferSparse));
    controlRequestChannel_ = uri.toString();
    return *this;
}